

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O2

void do_hide_and_save_proc(Am_Object *cmd)

{
  Am_Object_Method_Type *pAVar1;
  Am_Value *pAVar2;
  Am_Object window;
  Am_Object obj;
  Am_Object local_18;
  
  obj.data = (Am_Object_Data *)0x0;
  Am_Object::Get_Owner(&window,(Am_Slot_Flags)cmd);
  Am_Object::operator=(&obj,&window);
  Am_Object::~Am_Object(&window);
  window.data = (Am_Object_Data *)0x0;
  pAVar2 = (Am_Value *)Am_Object::Get((ushort)&obj,0x68);
  Am_Object::operator=(&window,pAVar2);
  Am_Object::Set((ushort)&window,true,0);
  pAVar1 = do_save_file.Call;
  Am_Object::Am_Object(&local_18,cmd);
  (*pAVar1)((Am_Object_Data *)&local_18);
  Am_Object::~Am_Object(&local_18);
  if (dirty == true) {
    Am_Object::Set((ushort)cmd,0x154,0);
  }
  Am_Object::~Am_Object(&window);
  Am_Object::~Am_Object(&obj);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_hide_and_save, (Am_Object cmd))
{
  Am_Object obj; // the cancel button
  obj = cmd.Get_Owner();
  Am_Object window;
  window = obj.Get(Am_WINDOW);
  window.Set(Am_VISIBLE, false);

  do_save_file.Call(cmd);

  if (dirty)
    cmd.Set(Am_IMPLEMENTATION_PARENT, 0);
}